

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<int,_2>::TPZManVector(TPZManVector<int,_2> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  int64_t in_stack_ffffffffffffffc8;
  TPZVec<int> *in_stack_ffffffffffffffd0;
  
  TPZVec<int>::TPZVec(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__TPZManVector_023dc8d8;
  if ((long)in_RSI < 3) {
    in_RDI[1] = in_RDI + 4;
    in_RDI[2] = in_RSI;
    in_RDI[3] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}